

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<asl::Map<asl::String,_char>::KeyVal>::dup
          (Array<asl::Map<asl::String,_char>::KeyVal> *this,int __fd)

{
  char *pcVar1;
  KeyVal *in_RAX;
  KeyVal *p;
  Array<asl::Map<asl::String,_char>::KeyVal> b;
  Array<asl::Map<asl::String,_char>::KeyVal> local_18;
  
  p = this->_a;
  if (*(int *)&p[-1].value != 1) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)((long)&p[-1].key.field_2 + 8));
    if (this->_a != local_18._a) {
      LOCK();
      pcVar1 = &this->_a[-1].value;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      UNLOCK();
      if (*(int *)pcVar1 == 0) {
        free(this,p);
      }
      this->_a = (KeyVal *)local_18;
      LOCK();
      *(int *)&local_18._a[-1].value = *(int *)&local_18._a[-1].value + 1;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}